

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

double * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::operator()
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,size_t row,size_t col)

{
  bool bVar1;
  size_t index_00;
  VectorDynSize *in_RDI;
  size_t index;
  size_t in_stack_00000030;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_stack_00000038;
  undefined8 local_8;
  
  bVar1 = valueIndexForOuterAndInnerIndices(this,row,col,(size_t *)index);
  if (bVar1) {
    local_8 = VectorDynSize::operator()(in_RDI,0);
  }
  else {
    index_00 = insert(in_stack_00000038,in_stack_00000030,(size_t)this,(double)row);
    local_8 = VectorDynSize::operator()(in_RDI,index_00);
  }
  return local_8;
}

Assistant:

double& SparseMatrix<iDynTree::RowMajor>::operator()(std::size_t row, std::size_t col)
    {
        assert(row >= 0 && row < rows()
               && col >= 0 && col < columns());

        std::size_t index = 0;
        if (valueIndexForOuterAndInnerIndices(row, col, index)) {
            return m_values(index);
        } else {
            return m_values(insert(row, col, 0));
        }
    }